

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::ScopeRandomizeFunction::ScopeRandomizeFunction(ScopeRandomizeFunction *this)

{
  allocator<char> local_31;
  string local_30;
  ScopeRandomizeFunction *local_10;
  ScopeRandomizeFunction *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"randomize",&local_31);
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,&local_30,Function);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__ScopeRandomizeFunction_009164d0;
  (this->super_SystemSubroutine).withClauseMode = Randomize;
  return;
}

Assistant:

ScopeRandomizeFunction() : SystemSubroutine("randomize", SubroutineKind::Function) {
        withClauseMode = WithClauseMode::Randomize;
    }